

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int check_leafref_config(lys_node_leaf *leaf,lys_type *type)

{
  ly_ctx *ctx;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_24;
  uint i;
  lys_type *type_local;
  lys_node_leaf *leaf_local;
  
  if (type->base == LY_TYPE_LEAFREF) {
    if (((((leaf->flags & 1) != 0) && ((type->info).lref.target != (lys_node_leaf *)0x0)) &&
        ((type->info).lref.req != -1)) && ((((type->info).lref.target)->flags & 2) != 0)) {
      ctx = leaf->module->ctx;
      pcVar2 = strnodetype(leaf->nodetype);
      pcVar3 = strnodetype(((type->info).lref.target)->nodetype);
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,leaf,
              "The leafref %s is config but refers to a non-config %s.",pcVar2,pcVar3);
      return -1;
    }
  }
  else if (type->base == LY_TYPE_UNION) {
    for (local_24 = 0; local_24 < (type->info).bits.count; local_24 = local_24 + 1) {
      iVar1 = check_leafref_config
                        (leaf,(lys_type *)((long)(type->info).bits.bit + (ulong)local_24 * 0x40));
      if (iVar1 != 0) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

static int
check_leafref_config(struct lys_node_leaf *leaf, struct lys_type *type)
{
    unsigned int i;

    if (type->base == LY_TYPE_LEAFREF) {
        if ((leaf->flags & LYS_CONFIG_W) && type->info.lref.target && type->info.lref.req != -1 &&
                (type->info.lref.target->flags & LYS_CONFIG_R)) {
            LOGVAL(leaf->module->ctx, LYE_SPEC, LY_VLOG_LYS, leaf, "The leafref %s is config but refers to a non-config %s.",
                   strnodetype(leaf->nodetype), strnodetype(type->info.lref.target->nodetype));
            return -1;
        }
        /* we can skip the test in case the leafref is not yet resolved. In that case the test is done in the time
         * of leafref resolving (lys_leaf_add_leafref_target()) */
    } else if (type->base == LY_TYPE_UNION) {
        for (i = 0; i < type->info.uni.count; i++) {
            if (check_leafref_config(leaf, &type->info.uni.types[i])) {
                return -1;
            }
        }
    }
    return 0;
}